

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

bool __thiscall
MemoryManager::setShort(MemoryManager *this,uint32_t addr,uint16_t val,uint32_t *cycles)

{
  bool bVar1;
  
  bVar1 = isAddrExist(this,addr);
  if (bVar1) {
    setByte(this,addr,(uint8_t)val,cycles);
    setByte(this,addr + 1,(uint8_t)(val >> 8),(uint32_t *)0x0);
  }
  else {
    dbgprintf("Short write to invalid addr 0x%x!\n",addr);
  }
  return bVar1;
}

Assistant:

bool MemoryManager::setShort(uint32_t addr, uint16_t val, uint32_t *cycles) {
  if (!this->isAddrExist(addr)) {
    dbgprintf("Short write to invalid addr 0x%x!\n", addr);
    return false;
  }
  this->setByte(addr, val & 0xFF, cycles);
  this->setByte(addr + 1, (val >> 8) & 0xFF);
  return true;
}